

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void set_DSPControl_pos(uint32_t pos,CPUMIPSState_conflict5 *env)

{
  target_ulong dspc;
  CPUMIPSState_conflict5 *env_local;
  uint32_t pos_local;
  
  (env->active_tc).DSPControl = (ulong)(pos & 0x7f) | (env->active_tc).DSPControl & 0xffffff80;
  return;
}

Assistant:

static inline void set_DSPControl_pos(uint32_t pos, CPUMIPSState *env)
{
    target_ulong dspc;

    dspc = env->active_tc.DSPControl;
#ifndef TARGET_MIPS64
    dspc = dspc & 0xFFFFFFC0;
    dspc |= (pos & 0x3F);
#else
    dspc = dspc & 0xFFFFFF80;
    dspc |= (pos & 0x7F);
#endif
    env->active_tc.DSPControl = dspc;
}